

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O2

void subBlock(treeNode *tn)

{
  bool bVar1;
  int iVar2;
  treeNode *ptVar3;
  long lVar4;
  allocator local_f1;
  treeNode *sen_BLOCKt;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"jmp",(allocator *)&sen_BLOCKt);
  addCode(&local_48,0,-1);
  std::__cxx11::string::~string((string *)&local_48);
  lVar4 = (long)cx;
  bVar1 = std::operator==(&sym_abi_cxx11_,"const");
  if (bVar1) {
    ptVar3 = (treeNode *)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_68,anon_var_dwarf_7e95,&local_f1);
    treeNode::treeNode(ptVar3,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    sen_BLOCKt = ptVar3;
    std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&tn->child,&sen_BLOCKt);
    const_BLOCK(sen_BLOCKt);
  }
  bVar1 = std::operator==(&sym_abi_cxx11_,"var");
  if (bVar1) {
    ptVar3 = (treeNode *)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_88,anon_var_dwarf_7ea1,&local_f1);
    treeNode::treeNode(ptVar3,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    sen_BLOCKt = ptVar3;
    std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&tn->child,&sen_BLOCKt);
    iVar2 = var_BLOCK(sen_BLOCKt);
    iVar2 = iVar2 + 3;
  }
  else {
    iVar2 = 3;
  }
  bVar1 = std::operator==(&sym_abi_cxx11_,"procedure");
  if (bVar1) {
    ptVar3 = (treeNode *)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_a8,anon_var_dwarf_7ead,&local_f1);
    treeNode::treeNode(ptVar3,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    sen_BLOCKt = ptVar3;
    std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&tn->child,&sen_BLOCKt);
    procedure_BLOCK(sen_BLOCKt);
  }
  ptVar3 = (treeNode *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_c8,anon_var_dwarf_7f63 + 6,&local_f1);
  treeNode::treeNode(ptVar3,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  sen_BLOCKt = ptVar3;
  std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&tn->child,&sen_BLOCKt);
  std::__cxx11::string::string((string *)&local_e8,"int",&local_f1);
  addCode(&local_e8,0,iVar2);
  std::__cxx11::string::~string((string *)&local_e8);
  codes.super__Vector_base<codeEle,_std::allocator<codeEle>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar4 + -1].offset = cx + -1;
  sen_BLOCK(sen_BLOCKt);
  return;
}

Assistant:

void subBlock(treeNode* tn)
{
    addCode("jmp",0,-1);        //跳转到语句部分
    int tmpCodeAddr = cx - 1;
    int varcount = 0;
    if (sym == "const") {
        auto *const_BLOCKt = new treeNode("常量说明部分");
        tn->child.push_back(const_BLOCKt);
        const_BLOCK(const_BLOCKt);              //常量说明
    }
    if (sym == "var") {
        auto *var_BLOCKt = new treeNode("变量说明部分");
        tn->child.push_back(var_BLOCKt);
        varcount = var_BLOCK(var_BLOCKt);                //变量说明
    }
    if (sym == "procedure") {
        auto *procedure_BLOCKt = new treeNode("过程说明部分");
        tn->child.push_back(procedure_BLOCKt);
        procedure_BLOCK(procedure_BLOCKt);          //过程说明
    }
    auto *sen_BLOCKt = new treeNode("语句");
    tn->child.push_back(sen_BLOCKt);
    //添加代码
    addCode("int",0,varcount+3);
    codes[tmpCodeAddr].offset = cx - 1;
    //
    sen_BLOCK(sen_BLOCKt);                //语句
}